

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::PlanFieldNames(FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 *this,size_t parent_scope_size,string_view name,string *opt_json_name)

{
  string_view name_00;
  bool bVar1;
  FieldNameCase FVar2;
  LogMessage *pLVar3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  string_view input;
  string_view input_00;
  string_view input_01;
  int local_e0;
  int local_70;
  size_t total_bytes;
  int kNullCharSize;
  int kIndexSize;
  LogMessage local_48;
  Voidify local_31;
  string *local_30;
  string *opt_json_name_local;
  size_t parent_scope_size_local;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)name._M_len;
  local_30 = opt_json_name;
  opt_json_name_local = (string *)parent_scope_size;
  parent_scope_size_local = (size_t)this;
  bVar1 = has_allocated(this);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1ff,"!has_allocated()");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_70 = (int)sVar4 + 0x11;
  if (opt_json_name_local != (string *)0x0) {
    local_70 = (int)opt_json_name_local + 1 + local_70;
  }
  if (local_30 == (string *)0x0) {
    name_00._M_str = (char *)name_local._M_len;
    name_00._M_len = (size_t)this_local;
    FVar2 = GetFieldNameCase(this,name_00);
    if (FVar2 == 0) {
      PlanArray<char>(this,local_70);
      return;
    }
    if (FVar2 == 1) {
      input._M_str = extraout_RDX;
      input._M_len = name_local._M_len;
      sVar5 = CamelCaseSize((anon_unknown_24 *)this_local,input);
      PlanArray<char>(this,local_70 + (int)sVar5 + 1);
      return;
    }
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  input_00._M_str = extraout_RDX_00;
  input_00._M_len = name_local._M_len;
  sVar5 = CamelCaseSize((anon_unknown_24 *)this_local,input_00);
  if (local_30 == (string *)0x0) {
    input_01._M_str = extraout_RDX_01;
    input_01._M_len = name_local._M_len;
    sVar6 = JsonNameSize((anon_unknown_24 *)this_local,input_01);
    local_e0 = (int)sVar6;
  }
  else {
    local_e0 = std::__cxx11::string::size();
  }
  PlanArray<char>(this,local_e0 + (int)sVar5 + (int)sVar4 + 3 + local_70);
  return;
}

Assistant:

void PlanFieldNames(size_t parent_scope_size, const absl::string_view name,
                      const std::string* opt_json_name) {
    ABSL_CHECK(!has_allocated());

    // name size, full_name size, lowercase (offset, size),
    // camelcase (offset, size), json (offset, size),
    constexpr int kIndexSize = 8 * sizeof(uint16_t);

    constexpr int kNullCharSize = 1;
    size_t total_bytes = kIndexSize + name.size() + kNullCharSize;
    if (parent_scope_size != 0) {
      total_bytes += parent_scope_size + /* '.' */ 1;
    }

    // Fast path for snake_case names, which follow the style guide.
    if (opt_json_name == nullptr) {
      switch (GetFieldNameCase(name)) {
        case FieldNameCase::kAllLower:
          // Case 1: they are all the same.
          return PlanArray<char>(total_bytes);
        case FieldNameCase::kSnakeCase: {
          // Case 2: name==lower, camel==json
          return PlanArray<char>(total_bytes + CamelCaseSize(name) +
                                 kNullCharSize);
        }
        default:
          break;
      }
    }

    // lowercase
    total_bytes += name.size() + kNullCharSize;
    // camelcase
    total_bytes += CamelCaseSize(name) + kNullCharSize;
    // json_name
    total_bytes += (opt_json_name != nullptr ? opt_json_name->size()
                                             : JsonNameSize(name)) +
                   kNullCharSize;
    PlanArray<char>(total_bytes);
  }